

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

int areBlanks(xmlParserCtxtPtr ctxt,xmlChar *str,int len,int blank_chars)

{
  xmlChar xVar1;
  xmlChar *pxVar2;
  xmlNode *node;
  int iVar3;
  xmlNodePtr node_00;
  ulong uVar4;
  
  if (ctxt->sax->ignorableWhitespace == ctxt->sax->characters) {
    return 0;
  }
  if (ctxt->space == (int *)0x0) {
    return 0;
  }
  iVar3 = *ctxt->space;
  if (iVar3 == -2) {
    return 0;
  }
  if (iVar3 == 1) {
    return 0;
  }
  if (0 < len && blank_chars == 0) {
    uVar4 = 0;
    do {
      if ((0x20 < (ulong)str[uVar4]) || ((0x100002600U >> ((ulong)str[uVar4] & 0x3f) & 1) == 0)) {
        return 0;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)len != uVar4);
  }
  if (ctxt->node == (xmlNodePtr)0x0) {
    return 0;
  }
  if (ctxt->myDoc != (xmlDocPtr)0x0) {
    iVar3 = xmlIsMixedElement(ctxt->myDoc,ctxt->node->name);
    if (iVar3 == 0) {
      return 1;
    }
    if (iVar3 == 1) {
      return 0;
    }
  }
  pxVar2 = ctxt->input->cur;
  xVar1 = *pxVar2;
  if ((xVar1 != '<') && (xVar1 != '\r')) {
    return 0;
  }
  if (((xVar1 == '<') && (ctxt->node->children == (_xmlNode *)0x0)) && (pxVar2[1] == '/')) {
    return 0;
  }
  node_00 = xmlGetLastChild(ctxt->node);
  if (node_00 == (xmlNodePtr)0x0) {
    if ((ctxt->node->type != XML_ELEMENT_NODE) && (ctxt->node->content != (xmlChar *)0x0)) {
      return 0;
    }
  }
  else {
    iVar3 = xmlNodeIsText(node_00);
    if (iVar3 != 0) {
      return 0;
    }
    node = ctxt->node->children;
    if ((node != (xmlNode *)0x0) && (iVar3 = xmlNodeIsText(node), iVar3 != 0)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int areBlanks(htmlParserCtxtPtr ctxt, const xmlChar *str, int len) {
    unsigned int i;
    int j;
    xmlNodePtr lastChild;
    xmlDtdPtr dtd;

    for (j = 0;j < len;j++)
        if (!(IS_BLANK_CH(str[j]))) return(0);

    if (CUR == 0) return(1);
    if (CUR != '<') return(0);
    if (ctxt->name == NULL)
	return(1);
    if (xmlStrEqual(ctxt->name, BAD_CAST"html"))
	return(1);
    if (xmlStrEqual(ctxt->name, BAD_CAST"head"))
	return(1);

    /* Only strip CDATA children of the body tag for strict HTML DTDs */
    if (xmlStrEqual(ctxt->name, BAD_CAST "body") && ctxt->myDoc != NULL) {
        dtd = xmlGetIntSubset(ctxt->myDoc);
        if (dtd != NULL && dtd->ExternalID != NULL) {
            if (!xmlStrcasecmp(dtd->ExternalID, BAD_CAST "-//W3C//DTD HTML 4.01//EN") ||
                    !xmlStrcasecmp(dtd->ExternalID, BAD_CAST "-//W3C//DTD HTML 4//EN"))
                return(1);
        }
    }

    if (ctxt->node == NULL) return(0);
    lastChild = xmlGetLastChild(ctxt->node);
    while ((lastChild) && (lastChild->type == XML_COMMENT_NODE))
	lastChild = lastChild->prev;
    if (lastChild == NULL) {
        if ((ctxt->node->type != XML_ELEMENT_NODE) &&
            (ctxt->node->content != NULL)) return(0);
	/* keep ws in constructs like ...<b> </b>...
	   for all tags "b" allowing PCDATA */
	for ( i = 0; i < sizeof(allowPCData)/sizeof(allowPCData[0]); i++ ) {
	    if ( xmlStrEqual(ctxt->name, BAD_CAST allowPCData[i]) ) {
		return(0);
	    }
	}
    } else if (xmlNodeIsText(lastChild)) {
        return(0);
    } else {
	/* keep ws in constructs like <p><b>xy</b> <i>z</i><p>
	   for all tags "p" allowing PCDATA */
	for ( i = 0; i < sizeof(allowPCData)/sizeof(allowPCData[0]); i++ ) {
	    if ( xmlStrEqual(lastChild->name, BAD_CAST allowPCData[i]) ) {
		return(0);
	    }
	}
    }
    return(1);
}